

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int CmdCommandTime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"ch");
    if (iVar2 != 99) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    if (bVar1) {
      pAbc->TimeTotal = pAbc->TimeCommand + pAbc->TimeTotal;
    }
    else {
      if (globalUtilOptind != argc) goto LAB_00285466;
      pAbc->TimeTotal = pAbc->TimeTotal + pAbc->TimeCommand;
      fprintf((FILE *)pAbc->Out,"elapse: %3.2f seconds, total: %3.2f seconds\n");
    }
    pAbc->TimeCommand = 0.0;
    iVar2 = 0;
  }
  else {
LAB_00285466:
    fwrite("usage: time [-ch]\n",0x12,1,(FILE *)pAbc->Err);
    fwrite("      \t\tprint the runtime since the last call\n",0x2e,1,(FILE *)pAbc->Err);
    fwrite("   -c \t\tclears the elapsed time without printing it\n",0x34,1,(FILE *)pAbc->Err);
    fwrite("   -h \t\tprint the command usage\n",0x20,1,(FILE *)pAbc->Err);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CmdCommandTime( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;
    int fClear;

    fClear = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fClear ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fClear )
    {
        pAbc->TimeTotal += pAbc->TimeCommand;
        pAbc->TimeCommand = 0.0;
        return 0;
    }

    if ( argc != globalUtilOptind )
    {
        goto usage;
    }


    pAbc->TimeTotal += pAbc->TimeCommand;
    fprintf( pAbc->Out, "elapse: %3.2f seconds, total: %3.2f seconds\n",
        pAbc->TimeCommand, pAbc->TimeTotal );
/*
    {
        FILE * pTable;
        pTable = fopen( "runtimes.txt", "a+" );
        fprintf( pTable, "%4.2f\n", pAbc->TimeCommand );
        fclose( pTable );
    }
*/
    pAbc->TimeCommand = 0.0;
    return 0;

  usage:
    fprintf( pAbc->Err, "usage: time [-ch]\n" );
    fprintf( pAbc->Err, "      \t\tprint the runtime since the last call\n" );
    fprintf( pAbc->Err, "   -c \t\tclears the elapsed time without printing it\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return 1;
}